

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

int secp256k1_fe_equal_var(secp256k1_fe *a,secp256k1_fe *b)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_50;
  secp256k1_fe na;
  
  secp256k1_fe_verify(a);
  secp256k1_fe_verify(b);
  if (a->magnitude < 2) {
    if (b->magnitude < 0x20) {
      secp256k1_fe_negate_unchecked(&na,a,1);
      secp256k1_fe_add(&na,b);
      iVar1 = secp256k1_fe_normalizes_to_zero_var(&na);
      return iVar1;
    }
    pcVar2 = "test condition failed: b->magnitude <= 31";
    uStack_50 = 0x28;
  }
  else {
    pcVar2 = "test condition failed: a->magnitude <= 1";
    uStack_50 = 0x27;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
          ,uStack_50,pcVar2);
  abort();
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_equal_var(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe na;
#ifdef VERIFY
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(b);
    VERIFY_CHECK(a->magnitude <= 1);
    VERIFY_CHECK(b->magnitude <= 31);
#endif
    secp256k1_fe_negate(&na, a, 1);
    secp256k1_fe_add(&na, b);
    return secp256k1_fe_normalizes_to_zero_var(&na);
}